

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

value_type_conflict * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
          (value_type_conflict *__return_storage_ptr__,optional<std::__cxx11::string> *this,
          char (*v) [1])

{
  char (*pacVar1) [1];
  bool bVar2;
  value_type *pvVar3;
  allocator local_21;
  char (*local_20) [1];
  char (*v_local) [1];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = v;
  v_local = (char (*) [1])this;
  this_local = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__return_storage_ptr__;
  bVar2 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this);
  pacVar1 = local_20;
  if (bVar2) {
    pvVar3 = detail::
             storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(this + 8));
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar3);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,*pacVar1,&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

optional_constexpr value_type value_or( U && v ) const optional_ref_qual
    {
        return has_value() ? contained.value() : static_cast<T>(std::forward<U>( v ) );
    }